

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::AssertSnapEquiv
               (SlotArrayInfo *sai1,SlotArrayInfo *sai2,TTDCompareMap *compareMap)

{
  uint local_30;
  bool local_29;
  uint32 j;
  uint uStack_24;
  bool found;
  PropertyId id1;
  uint32 i;
  TTDCompareMap *compareMap_local;
  SlotArrayInfo *sai2_local;
  SlotArrayInfo *sai1_local;
  
  TTDCompareMap::DiagnosticAssert(compareMap,sai1->ScriptContextLogId == sai2->ScriptContextLogId);
  TTDCompareMap::DiagnosticAssert
            (compareMap,(sai1->isFunctionBodyMetaData & 1U) == (sai2->isFunctionBodyMetaData & 1U));
  if ((sai1->isFunctionBodyMetaData & 1U) != 0) {
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_FunctionBody
              (compareMap,sai1->OptFunctionBodyId,sai2->OptFunctionBodyId);
  }
  TTDCompareMap::DiagnosticAssert(compareMap,sai1->SlotCount == sai2->SlotCount);
  uStack_24 = 0;
  do {
    if (sai1->SlotCount <= uStack_24) {
      return;
    }
    local_29 = false;
    for (local_30 = 0; local_30 < sai1->SlotCount; local_30 = local_30 + 1) {
      if (sai1->PIDArray[uStack_24] == sai2->PIDArray[local_30]) {
        AssertSnapEquivTTDVar_SlotArray
                  (sai1->Slots[uStack_24],sai2->Slots[local_30],compareMap,uStack_24);
        local_29 = true;
        break;
      }
    }
    TTDCompareMap::DiagnosticAssert(compareMap,local_29);
    uStack_24 = uStack_24 + 1;
  } while( true );
}

Assistant:

void AssertSnapEquiv(const SlotArrayInfo* sai1, const SlotArrayInfo* sai2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(sai1->ScriptContextLogId == sai2->ScriptContextLogId);

            compareMap.DiagnosticAssert(sai1->isFunctionBodyMetaData == sai2->isFunctionBodyMetaData);
            if(sai1->isFunctionBodyMetaData)
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_FunctionBody(sai1->OptFunctionBodyId, sai2->OptFunctionBodyId);
            }
            else
            {
                //TODO: emit debugger scope metadata
            }

            compareMap.DiagnosticAssert(sai1->SlotCount == sai2->SlotCount);
            for(uint32 i = 0; i < sai1->SlotCount; ++i)
            {
                Js::PropertyId id1 = sai1->PIDArray[i];
                bool found = false;
                for(uint32 j = 0; j < sai1->SlotCount; ++j)
                {
                    if(id1 == sai2->PIDArray[j])
                    {
                        AssertSnapEquivTTDVar_SlotArray(sai1->Slots[i], sai2->Slots[j], compareMap, i);
                        found = true;
                        break;
                    }
                }
                //TODO: We see this hit in a case where record has all values in a slot array when replaying --replay-debug (but not --replay).
                //      In the debug version the propertyId is in a Js::DebuggerScopeProperty instead. So this needs to be investigated in both extract and inflate.
                compareMap.DiagnosticAssert(found);
            }
        }